

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Resolver.cc
# Opt level: O3

SchemaResolution
avro::anon_unknown_31::checkUnionMatch(NodePtr *writer,NodePtr *reader,size_t *index)

{
  int iVar1;
  int iVar2;
  SchemaResolution SVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ulong uVar4;
  SchemaResolution SVar5;
  
  *index = 0;
  iVar1 = (*reader->px->_vptr_Node[4])();
  if (CONCAT44(extraout_var,iVar1) == 0) {
    SVar5 = RESOLVE_NO_MATCH;
  }
  else {
    SVar5 = RESOLVE_NO_MATCH;
    uVar4 = 0;
    do {
      iVar2 = (*reader->px->_vptr_Node[5])(reader->px,uVar4 & 0xffffffff);
      SVar3 = (*writer->px->_vptr_Node[0xc])
                        (writer->px,*(undefined8 *)CONCAT44(extraout_var_00,iVar2));
      if (SVar3 == RESOLVE_MATCH) {
        *index = uVar4;
        return RESOLVE_MATCH;
      }
      if (SVar5 == RESOLVE_NO_MATCH) {
        *index = uVar4;
        SVar5 = SVar3;
      }
      uVar4 = uVar4 + 1;
    } while (CONCAT44(extraout_var,iVar1) != uVar4);
  }
  return SVar5;
}

Assistant:

SchemaResolution    
checkUnionMatch(const NodePtr &writer, const NodePtr &reader, size_t &index)
{
    SchemaResolution bestMatch = RESOLVE_NO_MATCH;
 
    index = 0;
    size_t leaves = reader->leaves();

    for(size_t i=0; i < leaves; ++i) {

        const NodePtr &leaf = reader->leafAt(i);
        SchemaResolution newMatch = writer->resolve(*leaf);

        if(newMatch == RESOLVE_MATCH) {
            bestMatch = newMatch;
            index = i;
            break;
        }
        if(bestMatch == RESOLVE_NO_MATCH) {
            bestMatch = newMatch;
            index = i;
        }
    }

    return bestMatch;
}